

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

Uint32 GPU_LoadShader(GPU_ShaderEnum shader_type,char *filename)

{
  Uint32 UVar1;
  SDL_RWops *shader_source;
  
  if (filename == (char *)0x0) {
    GPU_PushErrorCode("GPU_LoadShader",GPU_ERROR_NULL_ARGUMENT,"filename");
  }
  else {
    shader_source = (SDL_RWops *)SDL_RWFromFile(filename,"r");
    if (shader_source != (SDL_RWops *)0x0) {
      UVar1 = GPU_CompileShader_RW(shader_type,shader_source,true);
      return UVar1;
    }
    GPU_PushErrorCode("GPU_LoadShader",GPU_ERROR_FILE_NOT_FOUND,"%s",filename);
  }
  return 0;
}

Assistant:

Uint32 GPU_LoadShader(GPU_ShaderEnum shader_type, const char* filename)
{
    SDL_RWops* rwops;

    if(filename == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_NULL_ARGUMENT, "filename");
        return 0;
    }
    
    rwops = SDL_RWFromFile(filename, "r");
    if(rwops == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_FILE_NOT_FOUND, "%s", filename);
        return 0;
    }
    
    return GPU_CompileShader_RW(shader_type, rwops, 1);
}